

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O1

void Aig_ObjCollectMulti_rec(Aig_Obj_t *pRoot,Aig_Obj_t *pObj,Vec_Ptr_t *vSuper)

{
  uint uVar1;
  uint uVar2;
  void **ppvVar3;
  long lVar4;
  int iVar5;
  
  while ((pRoot == pObj ||
         (((((ulong)pObj & 1) == 0 &&
           (uVar2 = (uint)*(undefined8 *)&pObj->field_0x18, (uVar2 & 7) != 2)) &&
          (((uVar2 ^ *(uint *)&pRoot->field_0x18) & 7) == 0))))) {
    Aig_ObjCollectMulti_rec(pRoot,pObj->pFanin0,vSuper);
    pObj = pObj->pFanin1;
  }
  uVar2 = vSuper->nSize;
  if (0 < (long)(int)uVar2) {
    lVar4 = 0;
    do {
      if ((Aig_Obj_t *)vSuper->pArray[lVar4] == pObj) {
        return;
      }
      lVar4 = lVar4 + 1;
    } while ((int)uVar2 != lVar4);
  }
  uVar1 = vSuper->nCap;
  if (uVar2 == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vSuper->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(vSuper->pArray,0x80);
      }
      vSuper->pArray = ppvVar3;
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar1 * 2;
      if (iVar5 <= (int)uVar1) goto LAB_006163bb;
      if (vSuper->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar3 = (void **)realloc(vSuper->pArray,(ulong)uVar1 << 4);
      }
      vSuper->pArray = ppvVar3;
    }
    vSuper->nCap = iVar5;
  }
LAB_006163bb:
  iVar5 = vSuper->nSize;
  vSuper->nSize = iVar5 + 1;
  vSuper->pArray[iVar5] = pObj;
  return;
}

Assistant:

void Aig_ObjCollectMulti_rec( Aig_Obj_t * pRoot, Aig_Obj_t * pObj, Vec_Ptr_t * vSuper )
{
    if ( pRoot != pObj && (Aig_IsComplement(pObj) || Aig_ObjIsCi(pObj) || Aig_ObjType(pRoot) != Aig_ObjType(pObj)) )
    {
        Vec_PtrPushUnique(vSuper, pObj);
        return;
    }
    Aig_ObjCollectMulti_rec( pRoot, Aig_ObjChild0(pObj), vSuper );
    Aig_ObjCollectMulti_rec( pRoot, Aig_ObjChild1(pObj), vSuper );
}